

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatasrc.c
# Opt level: O0

boolean fill_input_buffer(j_decompress_ptr cinfo)

{
  undefined8 *puVar1;
  long *in_RDI;
  size_t nbytes;
  my_src_ptr src;
  size_t local_18;
  
  puVar1 = (undefined8 *)in_RDI[5];
  local_18 = fread((void *)puVar1[8],1,0x1000,(FILE *)puVar1[7]);
  if (local_18 == 0) {
    if (*(int *)(puVar1 + 9) != 0) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x2a;
      (**(code **)*in_RDI)(in_RDI);
    }
    *(undefined4 *)(*in_RDI + 0x28) = 0x78;
    (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
    *(undefined1 *)puVar1[8] = 0xff;
    *(undefined1 *)(puVar1[8] + 1) = 0xd9;
    local_18 = 2;
  }
  *puVar1 = puVar1[8];
  puVar1[1] = local_18;
  *(undefined4 *)(puVar1 + 9) = 0;
  return 1;
}

Assistant:

METHODDEF(boolean)
fill_input_buffer(j_decompress_ptr cinfo)
{
  my_src_ptr src = (my_src_ptr)cinfo->src;
  size_t nbytes;

  nbytes = JFREAD(src->infile, src->buffer, INPUT_BUF_SIZE);

  if (nbytes <= 0) {
    if (src->start_of_file)     /* Treat empty input file as fatal error */
      ERREXIT(cinfo, JERR_INPUT_EMPTY);
    WARNMS(cinfo, JWRN_JPEG_EOF);
    /* Insert a fake EOI marker */
    src->buffer[0] = (JOCTET)0xFF;
    src->buffer[1] = (JOCTET)JPEG_EOI;
    nbytes = 2;
  }

  src->pub.next_input_byte = src->buffer;
  src->pub.bytes_in_buffer = nbytes;
  src->start_of_file = FALSE;

  return TRUE;
}